

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_telemetry_messenger.c
# Opt level: O2

int telemetry_messenger_get_send_status
              (TELEMETRY_MESSENGER_HANDLE messenger_handle,
              TELEMETRY_MESSENGER_SEND_STATUS *send_status)

{
  LIST_ITEM_HANDLE pLVar1;
  LIST_ITEM_HANDLE pLVar2;
  LOGGER_LOG p_Var3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  TELEMETRY_MESSENGER_INSTANCE_conflict *instance;
  
  if (messenger_handle == (TELEMETRY_MESSENGER_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    iVar5 = 0x633;
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return 0x633;
    }
    pcVar6 = "telemetry_messenger_get_send_status failed (messenger_handle is NULL)";
    iVar4 = 0x632;
  }
  else {
    if (send_status != (TELEMETRY_MESSENGER_SEND_STATUS *)0x0) {
      pLVar1 = singlylinkedlist_get_head_item(messenger_handle->waiting_to_send);
      pLVar2 = singlylinkedlist_get_head_item(messenger_handle->in_progress_list);
      *send_status = (uint)(pLVar2 != (LIST_ITEM_HANDLE)0x0 || pLVar1 != (LIST_ITEM_HANDLE)0x0);
      return 0;
    }
    p_Var3 = xlogging_get_log_function();
    iVar5 = 0x638;
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return 0x638;
    }
    pcVar6 = "telemetry_messenger_get_send_status failed (send_status is NULL)";
    iVar4 = 0x637;
  }
  (*p_Var3)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
            ,"telemetry_messenger_get_send_status",iVar4,1,pcVar6);
  return iVar5;
}

Assistant:

int telemetry_messenger_get_send_status(TELEMETRY_MESSENGER_HANDLE messenger_handle, TELEMETRY_MESSENGER_SEND_STATUS* send_status)
{
    int result;

    if (messenger_handle == NULL)
    {
        LogError("telemetry_messenger_get_send_status failed (messenger_handle is NULL)");
        result = MU_FAILURE;
    }
    else if (send_status == NULL)
    {
        LogError("telemetry_messenger_get_send_status failed (send_status is NULL)");
        result = MU_FAILURE;
    }
    else
    {
        TELEMETRY_MESSENGER_INSTANCE* instance = (TELEMETRY_MESSENGER_INSTANCE*)messenger_handle;
        LIST_ITEM_HANDLE wts_list_head = singlylinkedlist_get_head_item(instance->waiting_to_send);
        LIST_ITEM_HANDLE ip_list_head = singlylinkedlist_get_head_item(instance->in_progress_list);

        if (wts_list_head == NULL && ip_list_head == NULL)
        {
            *send_status = TELEMETRY_MESSENGER_SEND_STATUS_IDLE;
        }
        else
        {
            *send_status = TELEMETRY_MESSENGER_SEND_STATUS_BUSY;
        }

        result = RESULT_OK;
    }

    return result;
}